

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O1

int run_test_loop_stop(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uv_loop_t *loop;
  undefined1 auStack_d0 [160];
  uv_timer_t *puStack_30;
  
  puVar2 = uv_default_loop();
  uv_prepare_init(puVar2,&prepare_handle);
  uv_prepare_start(&prepare_handle,prepare_cb);
  puVar2 = uv_default_loop();
  uv_timer_init(puVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    run_test_loop_stop_cold_7();
LAB_00161634:
    run_test_loop_stop_cold_1();
LAB_00161639:
    run_test_loop_stop_cold_6();
LAB_0016163e:
    run_test_loop_stop_cold_2();
LAB_00161643:
    run_test_loop_stop_cold_3();
LAB_00161648:
    run_test_loop_stop_cold_4();
  }
  else {
    if (timer_called != 1) goto LAB_00161634;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
    if (iVar1 == 0) goto LAB_00161639;
    if (prepare_called < 2) goto LAB_0016163e;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00161643;
    if (timer_called != 10) goto LAB_00161648;
    if (prepare_called == 10) {
      return 0;
    }
  }
  run_test_loop_stop_cold_5();
  if (puVar2 == (uv_loop_t *)&prepare_handle) {
    prepare_called = prepare_called + 1;
    if (prepare_called == 10) {
      iVar1 = uv_prepare_stop(&prepare_handle);
      return iVar1;
    }
    return prepare_called;
  }
  prepare_cb_cold_1();
  iVar1 = timer_called;
  if (puVar2 == (uv_loop_t *)&timer_handle) {
    timer_called = timer_called + 1;
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_stop(puVar2);
      return extraout_EAX_00;
    }
    if (timer_called == 10) {
      iVar1 = uv_timer_stop(&timer_handle);
      return iVar1;
    }
    return extraout_EAX;
  }
  timer_cb_cold_1();
  puStack_30 = &timer_handle;
  auStack_d0._152_8_ = 0x1616d6;
  puVar2 = uv_default_loop();
  auStack_d0._152_8_ = 0x1616de;
  uVar3 = uv_now(puVar2);
  do {
    auStack_d0._152_8_ = 0x1616e6;
    puVar2 = uv_default_loop();
    auStack_d0._152_8_ = 0x1616ee;
    uVar4 = uv_now(puVar2);
    auStack_d0._152_8_ = 0x1616f9;
    puVar2 = uv_default_loop();
    if (999 < uVar4 - uVar3) goto LAB_0016171b;
    auStack_d0._152_8_ = 0x161712;
    iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
  } while (iVar1 == 0);
  auStack_d0._152_8_ = 0x16171b;
  run_test_loop_update_time_cold_2();
LAB_0016171b:
  auStack_d0._152_8_ = 0x16172c;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  auStack_d0._152_8_ = 0x161736;
  uv_run(puVar2,UV_RUN_DEFAULT);
  auStack_d0._152_8_ = 0x16173b;
  puVar2 = uv_default_loop();
  auStack_d0._152_8_ = 0x161743;
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  auStack_d0._152_8_ = run_test_loop_backend_timeout;
  run_test_loop_update_time_cold_1();
  auStack_d0._152_8_ = uVar3;
  loop = uv_default_loop();
  puVar2 = loop;
  iVar1 = uv_timer_init(loop,(uv_timer_t *)auStack_d0);
  if (iVar1 == 0) {
    puVar2 = loop;
    iVar1 = uv_loop_alive(loop);
    if (iVar1 != 0) goto LAB_00161833;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 != 0) goto LAB_00161838;
    puVar2 = (uv_loop_t *)auStack_d0;
    iVar1 = uv_timer_start((uv_timer_t *)puVar2,cb,1000,0);
    if (iVar1 != 0) goto LAB_0016183d;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 < 0x65) goto LAB_00161842;
    puVar2 = loop;
    iVar1 = uv_backend_timeout(loop);
    if (1000 < iVar1) goto LAB_00161847;
    puVar2 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016184c;
    iVar1 = uv_backend_timeout(loop);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00161856;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_00161833:
    run_test_loop_backend_timeout_cold_2();
LAB_00161838:
    run_test_loop_backend_timeout_cold_3();
LAB_0016183d:
    run_test_loop_backend_timeout_cold_4();
LAB_00161842:
    run_test_loop_backend_timeout_cold_5();
LAB_00161847:
    run_test_loop_backend_timeout_cold_6();
LAB_0016184c:
    loop = puVar2;
    run_test_loop_backend_timeout_cold_7();
  }
  run_test_loop_backend_timeout_cold_8();
LAB_00161856:
  run_test_loop_backend_timeout_cold_9();
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r != 0);
  ASSERT(timer_called == 1);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r != 0);
  ASSERT(prepare_called > 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(timer_called == 10);
  ASSERT(prepare_called == 10);

  return 0;
}